

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

NanoVDBBuffer * __thiscall pbrt::NanoVDBBuffer::operator=(NanoVDBBuffer *this,NanoVDBBuffer *other)

{
  clear(this);
  (this->alloc).memoryResource = (other->alloc).memoryResource;
  this->bytesAllocated = other->bytesAllocated;
  this->ptr = other->ptr;
  other->bytesAllocated = 0;
  other->ptr = (uint8_t *)0x0;
  return this;
}

Assistant:

NanoVDBBuffer &operator=(NanoVDBBuffer &&other) noexcept {
        // Note, this isn't how std containers work, but it's expedient for
        // our purposes here...
        clear();
        // operator= was deleted? Fine.
        new (&alloc) Allocator(other.alloc.resource());
        bytesAllocated = other.bytesAllocated;
        ptr = other.ptr;
        other.bytesAllocated = 0;
        other.ptr = nullptr;
        return *this;
    }